

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22c7f6c::PeerManagerImpl::PushAddress
          (PeerManagerImpl *this,Peer *peer,CAddress *addr)

{
  CRollingBloomFilter *this_00;
  bool bVar1;
  ulong range;
  unsigned_long uVar2;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((peer->m_addr_known)._M_t.
      super___uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>._M_t.
      super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
      super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl == (CRollingBloomFilter *)0x0
     ) {
    __assert_fail("peer.m_addr_known",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x4d9,
                  "void (anonymous namespace)::PeerManagerImpl::PushAddress(Peer &, const CAddress &)"
                 );
  }
  bVar1 = CNetAddr::IsValid((CNetAddr *)addr);
  if (bVar1) {
    this_00 = (peer->m_addr_known)._M_t.
              super___uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>.
              _M_t.
              super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>
              .super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl;
    CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,
                     &addr->super_CService);
    vKey.m_size = (long)local_50._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_50._M_impl.super__Vector_impl_data._M_start;
    vKey.m_data = local_50._M_impl.super__Vector_impl_data._M_start;
    bVar1 = CRollingBloomFilter::contains(this_00,vKey);
    if (bVar1) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
    }
    else {
      bVar1 = IsAddrCompatible(peer,addr);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
      if (bVar1) {
        range = ((long)(peer->m_addrs_to_send).
                       super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(peer->m_addrs_to_send).
                      super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x38;
        if (range < 1000) {
          std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&peer->m_addrs_to_send,addr);
        }
        else {
          uVar2 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                            (&(this->m_rng).super_RandomMixin<FastRandomContext>,range);
          CAddress::operator=((peer->m_addrs_to_send).
                              super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar2,addr);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::PushAddress(Peer& peer, const CAddress& addr)
{
    // Known checking here is only to save space from duplicates.
    // Before sending, we'll filter it again for known addresses that were
    // added after addresses were pushed.
    assert(peer.m_addr_known);
    if (addr.IsValid() && !peer.m_addr_known->contains(addr.GetKey()) && IsAddrCompatible(peer, addr)) {
        if (peer.m_addrs_to_send.size() >= MAX_ADDR_TO_SEND) {
            peer.m_addrs_to_send[m_rng.randrange(peer.m_addrs_to_send.size())] = addr;
        } else {
            peer.m_addrs_to_send.push_back(addr);
        }
    }
}